

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall
license::test::env_var_point_to_wrong_file::test_method(env_var_point_to_wrong_file *this)

{
  bool bVar1;
  ostream *poVar2;
  AuditEvent *pAVar3;
  undefined1 local_188 [24];
  char *local_170;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  long local_148 [2];
  shared_count sStack_138;
  LicenseReader licenseReader;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  EventRegistry registry;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  setenv("LICENSE_LOCATION",
         "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/this/file/doesnt/exist"
         ,1);
  locate::LocatorFactory::find_license_near_moduleb = 0;
  locate::LocatorFactory::find_license_with_env_varb = 1;
  LicenseReader::LicenseReader(&licenseReader,(LicenseLocation *)0x0);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_188,"PRODUCT",(allocator *)local_148);
  LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_188,&licenseInfos);
  std::__cxx11::string::~string((string *)local_188);
  poVar2 = license::operator<<((ostream *)std::cout,&registry);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x69);
  bVar1 = EventRegistry::isGood(&registry);
  local_148[0] = CONCAT71(local_148[0]._1_7_,!bVar1);
  local_148[1] = 0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_170 = (char *)&local_110;
  local_110 = "!registry.isGood()";
  local_108 = "";
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001cf238;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(local_148,local_188,&local_60,0x69,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_138);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x6a);
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001cf288;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_88 = "";
  local_110 = (char *)((ulong)local_110 & 0xffffffff00000000);
  local_148[0] = ((long)licenseInfos.
                        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_188,&local_90,0x6a,1,2,&local_110,"0",local_148,"licenseInfos.size()");
  pAVar3 = EventRegistry::getLastFailure(&registry);
  if (pAVar3 != (AuditEvent *)0x0) {
    local_a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_98 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x6c);
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_001cf288;
    local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_170 = "";
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_118 = "";
    local_148[0] = CONCAT44(local_148[0]._4_4_,1);
    pAVar3 = EventRegistry::getLastFailure(&registry);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
              (local_188,&local_120,0x6c,1,2,local_148,"LICENSE_FILE_NOT_FOUND",&pAVar3->event_type,
               "registry.getLastFailure()->event_type");
    unsetenv("LICENSE_LOCATION");
    EventRegistry::~EventRegistry(&registry);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure() != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                ,0x6b,"void license::test::env_var_point_to_wrong_file::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_point_to_wrong_file) {
	const char *environment_variable_value = PROJECT_TEST_SRC_DIR "/this/file/doesnt/exist";
	SETENV(LCC_LICENSE_LOCATION_ENV_VAR, environment_variable_value)
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);

	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	cout << registry << endl;
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_EQUAL(LICENSE_FILE_NOT_FOUND, registry.getLastFailure()->event_type);
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
}